

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

boolean encode_one_block(working_state *state,JCOEFPTR block,int last_dc_val,c_derived_tbl *dctbl,
                        c_derived_tbl *actbl)

{
  size_t *psVar1;
  short sVar2;
  bit_buf_type bVar3;
  jpeg_destination_mgr *pjVar4;
  int iVar5;
  uint uVar6;
  boolean bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  byte bVar16;
  byte *pbVar15;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  byte bVar20;
  byte bVar21;
  ulong uVar22;
  long lVar23;
  byte bVar24;
  uint uVar25;
  byte bVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  byte *pbVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  JOCTET _buffer [512];
  byte local_238 [520];
  
  iVar13 = (state->cur).free_bits;
  uVar17 = state->free_in_buffer;
  if (uVar17 < 0x200) {
    pbVar15 = local_238;
  }
  else {
    pbVar15 = state->next_output_byte;
  }
  bVar3 = (state->cur).put_buffer.c;
  iVar12 = *block - last_dc_val;
  iVar5 = -iVar12;
  if (0 < iVar12) {
    iVar5 = iVar12;
  }
  bVar11 = ""[iVar5];
  uVar25 = dctbl->ehufco[bVar11] << (bVar11 & 0x1f) |
           ~(uint)(-1L << (bVar11 & 0x3f)) & (iVar12 >> 0x1f) + iVar12;
  iVar12 = (int)dctbl->ehufsi[bVar11] + (uint)bVar11;
  iVar5 = iVar13 - iVar12;
  uVar31 = (ulong)(int)uVar25;
  if (iVar5 < 0) {
    bVar11 = -(char)iVar5 & 0x1f;
    uVar22 = (long)((int)uVar25 >> bVar11) | bVar3 << ((byte)iVar13 & 0x3f);
    bVar21 = (byte)(uVar22 >> 0x38);
    *pbVar15 = bVar21;
    bVar8 = (byte)uVar22;
    bVar16 = (byte)(uVar22 >> 8);
    bVar20 = (byte)(uVar22 >> 0x18);
    bVar18 = (byte)(uVar22 >> 0x20);
    bVar9 = (byte)(uVar22 >> 0x28);
    bVar26 = (byte)(uVar22 >> 0x30);
    bVar10 = (byte)(uVar22 >> 0x10);
    if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
      pbVar15[1] = bVar26;
      pbVar15[2] = bVar9;
      pbVar15[3] = bVar18;
      pbVar15[4] = bVar20;
      pbVar15[5] = bVar10;
      pbVar15[6] = bVar16;
      pbVar15[7] = bVar8;
      pbVar15 = pbVar15 + 8;
    }
    else {
      bVar11 = (byte)(0 >> bVar11);
      pbVar15[1] = bVar11;
      uVar29 = (ulong)(uVar22 >> 0x38 == 0xff);
      pbVar30 = pbVar15 + 1;
      if (bVar21 == 0xff) {
        pbVar30 = pbVar15 + 2;
      }
      pbVar15[uVar29 + 1] = bVar26;
      uVar19 = ~uVar22;
      bVar32 = (uVar19 & 0xff000000000000) == 0;
      pbVar15[uVar29 + 2] = bVar11;
      pbVar30[(ulong)bVar32 + 1] = bVar9;
      pbVar30[(ulong)bVar32 + 2] = bVar11;
      bVar33 = (uVar19 & 0xff0000000000) == 0;
      lVar23 = (ulong)bVar32 + 2;
      if (bVar33) {
        lVar23 = (ulong)bVar32 + 3;
      }
      pbVar15 = pbVar30 + lVar23;
      *pbVar15 = bVar18;
      pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = bVar11;
      bVar32 = (uVar19 & 0xff00000000) == 0;
      pbVar15[(ulong)bVar32 + 1] = bVar20;
      pbVar15[(ulong)bVar32 + 2] = bVar11;
      uVar25 = (uint)uVar22 & 0xff000000;
      lVar23 = (ulong)bVar32 + 3;
      if (uVar25 != 0xff000000) {
        lVar23 = (ulong)bVar32 + 2;
      }
      pbVar30 = pbVar15 + lVar23;
      *pbVar30 = bVar10;
      uVar14 = ~(uint)uVar22;
      bVar33 = (uVar14 & 0xff0000) == 0;
      pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = bVar11;
      pbVar30[(ulong)bVar33 + 1] = bVar16;
      pbVar30[(ulong)bVar33 + 2] = bVar11;
      bVar32 = (uVar14 & 0xff00) == 0;
      lVar23 = (ulong)bVar33 + 2;
      if (bVar32) {
        lVar23 = (ulong)bVar33 + 3;
      }
      pbVar30[lVar23] = bVar8;
      pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = bVar11;
      pbVar15 = pbVar30 + lVar23 + (ulong)(bVar8 == 0xff) + 1;
    }
    iVar5 = iVar5 + 0x40;
  }
  else {
    uVar31 = uVar31 | bVar3 << ((byte)iVar12 & 0x3f);
  }
  uVar25 = (uint)block[1];
  if (block[1] == 0) {
    lVar23 = 0x10;
  }
  else {
    uVar14 = -uVar25;
    if (0 < (int)uVar25) {
      uVar14 = uVar25;
    }
    bVar11 = ""[uVar14];
    uVar25 = actbl->ehufco[bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar25 >> 0x1f) + uVar25;
    iVar13 = (int)actbl->ehufsi[bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar25;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar25 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar18 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar16;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar18;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar16;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar18;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    lVar23 = 0;
    uVar31 = uVar22;
  }
  uVar25 = (uint)block[8];
  if (block[8] == 0) {
    uVar25 = (int)lVar23 + 0x10;
  }
  else {
    uVar14 = -uVar25;
    if (0 < (int)uVar25) {
      uVar14 = uVar25;
    }
    bVar11 = ""[uVar14];
    uVar25 = actbl->ehufco[lVar23 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar25 >> 0x1f) + uVar25;
    iVar13 = (int)actbl->ehufsi[lVar23 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar25;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar25 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar18 = (byte)(uVar31 >> 0x20);
      bVar9 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar9;
        pbVar15[3] = bVar18;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar9;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar18;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x10];
  if (block[0x10] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar18 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar16;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar18;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar16;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar18;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[9];
  if (block[9] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar9 = (byte)(uVar31 >> 0x18);
      bVar18 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar16;
        pbVar15[3] = bVar18;
        pbVar15[4] = bVar9;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar16;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar18;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar9;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[2];
  if (block[2] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[3];
  if (block[3] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar18 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar16;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar18;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar16;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar18;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[10];
  if (block[10] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x11];
  if (block[0x11] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar9 = (byte)(uVar31 >> 0x18);
      bVar16 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar16;
        pbVar15[4] = bVar9;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar16;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar9;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x18];
  if (block[0x18] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar18 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar16;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar18;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar16;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar18;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x20];
  if (block[0x20] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar18 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar16;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar18;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar16;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar18;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x19];
  if (block[0x19] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x12];
  if (block[0x12] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0xb];
  if (block[0xb] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[4];
  if (block[4] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar9 = (byte)(uVar31 >> 0x18);
      bVar16 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar16;
        pbVar15[4] = bVar9;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar16;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar9;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[5];
  if (block[5] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar22 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0xc];
  if (block[0xc] == 0) {
    uVar22 = (ulong)(uVar25 + 0x10);
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ~(uint)(-1L << (bVar11 & 0x3f)) & ((int)uVar14 >> 0x1f) + uVar14;
    iVar13 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar12 = iVar5 - iVar13;
    uVar29 = (ulong)(int)uVar14;
    if (iVar12 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar12 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar18 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar16;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar18;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar22 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar22 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar16;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar18;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar12 + 0x40;
    }
    else {
      uVar29 = uVar29 | uVar31 << ((byte)iVar13 & 0x3f);
      iVar5 = iVar12;
    }
    uVar22 = 0;
    uVar31 = uVar29;
  }
  uVar25 = (uint)block[0x13];
  if (block[0x13] == 0) {
    uVar25 = (uint)uVar22 + 0x10;
  }
  else {
    uVar14 = -uVar25;
    if (0 < (int)uVar25) {
      uVar14 = uVar25;
    }
    bVar11 = ""[uVar14];
    iVar13 = iVar5;
    if (0xff < (uint)uVar22) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar22 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU) | uVar31;
        bVar18 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar18;
        bVar26 = (byte)(uVar31 >> 0x20);
        bVar21 = (byte)(uVar31 >> 0x28);
        bVar20 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)uVar22;
        bVar16 = (byte)(uVar22 >> 8);
        bVar10 = (byte)(uVar22 >> 0x10);
        bVar8 = (byte)(uVar22 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar20;
          pbVar15[2] = bVar21;
          pbVar15[3] = bVar26;
          pbVar15[4] = bVar8;
          pbVar15[5] = bVar10;
          pbVar15[6] = bVar16;
          pbVar15[7] = bVar9;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar18 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar29 + 1] = bVar20;
          pbVar15[uVar29 + 2] = 0;
          uVar31 = ~uVar31;
          bVar32 = (uVar31 & 0xff000000000000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar21;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar31 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar26;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar31 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar8;
          pbVar15[(ulong)bVar32 + 2] = 0;
          uVar14 = (uint)uVar22 & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar14 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          *pbVar30 = bVar10;
          uVar6 = ~(uint)uVar22;
          bVar33 = (uVar6 & 0xff0000) == 0;
          pbVar15[(ulong)(uVar14 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          pbVar30[(ulong)bVar33 + 1] = bVar16;
          pbVar30[(ulong)bVar33 + 2] = 0;
          bVar32 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar33 + 2;
          if (bVar32) {
            lVar23 = (ulong)bVar33 + 3;
          }
          pbVar30[lVar23] = bVar9;
          pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
        }
        iVar13 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
      }
      uVar22 = 0;
    }
    uVar25 = actbl->ehufco[uVar22 + bVar11] << (bVar11 & 0x1f) |
             ((int)uVar25 >> 0x1f) + uVar25 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[uVar22 + bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    uVar22 = (ulong)(int)uVar25;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar25 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar20 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar20;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar18 = (byte)(uVar31 >> 0x18);
      bVar16 = (byte)(uVar31 >> 0x20);
      bVar9 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar9;
        pbVar15[3] = bVar16;
        pbVar15[4] = bVar18;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar21;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar9;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar16;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar18;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x1a];
  if (block[0x1a] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar26 = (byte)(uVar31 >> 0x28);
        bVar21 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar21;
          pbVar15[2] = bVar26;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar21;
          pbVar15[uVar22 + 2] = 0;
          uVar22 = ~uVar31;
          bVar32 = (uVar22 & 0xff000000000000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar26;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar22 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar22 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          pbVar15[(ulong)bVar32 + 2] = 0;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          *pbVar30 = bVar16 | bVar9;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar33 = (uVar6 & 0xff0000) == 0;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          pbVar30[(ulong)bVar33 + 1] = bVar20;
          pbVar30[(ulong)bVar33 + 2] = 0;
          bVar32 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar33 + 2;
          if (bVar32) {
            lVar23 = (ulong)bVar33 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar20;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x21];
  if (block[0x21] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar26 = (byte)(uVar31 >> 0x28);
        bVar21 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar21;
          pbVar15[2] = bVar26;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar21;
          pbVar15[uVar22 + 2] = 0;
          uVar22 = ~uVar31;
          bVar32 = (uVar22 & 0xff000000000000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar26;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar22 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar22 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          pbVar15[(ulong)bVar32 + 2] = 0;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          *pbVar30 = bVar16 | bVar9;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar33 = (uVar6 & 0xff0000) == 0;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          pbVar30[(ulong)bVar33 + 1] = bVar20;
          pbVar30[(ulong)bVar33 + 2] = 0;
          bVar32 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar33 + 2;
          if (bVar32) {
            lVar23 = (ulong)bVar33 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar9 = (byte)(uVar31 >> 0x18);
      bVar18 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar16;
        pbVar15[3] = bVar18;
        pbVar15[4] = bVar9;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar20;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar16;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar18;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar9;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x28];
  if (block[0x28] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar26 = (byte)(uVar31 >> 0x28);
        bVar21 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar21;
          pbVar15[2] = bVar26;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar21;
          pbVar15[uVar22 + 2] = 0;
          uVar22 = ~uVar31;
          bVar32 = (uVar22 & 0xff000000000000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar26;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar22 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar22 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          pbVar15[(ulong)bVar32 + 2] = 0;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          *pbVar30 = bVar16 | bVar9;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar33 = (uVar6 & 0xff0000) == 0;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          pbVar30[(ulong)bVar33 + 1] = bVar20;
          pbVar30[(ulong)bVar33 + 2] = 0;
          bVar32 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar33 + 2;
          if (bVar32) {
            lVar23 = (ulong)bVar33 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar18 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar16;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar18;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar20;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar16;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar18;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x30];
  if (block[0x30] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar21 = (byte)(uVar31 >> 0x28);
        bVar26 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar26;
          pbVar15[2] = bVar21;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar26;
          pbVar15[uVar22 + 2] = 0;
          uVar22 = ~uVar31;
          bVar32 = (uVar22 & 0xff000000000000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar21;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar22 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar22 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          pbVar15[(ulong)bVar32 + 2] = 0;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          *pbVar30 = bVar16 | bVar9;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar33 = (uVar6 & 0xff0000) == 0;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          pbVar30[(ulong)bVar33 + 1] = bVar20;
          pbVar30[(ulong)bVar33 + 2] = 0;
          bVar32 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar33 + 2;
          if (bVar32) {
            lVar23 = (ulong)bVar33 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar20;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x29];
  if (block[0x29] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar21 = (byte)(uVar31 >> 0x28);
        bVar26 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar26;
          pbVar15[2] = bVar21;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar26;
          pbVar15[uVar22 + 2] = 0;
          uVar22 = ~uVar31;
          bVar32 = (uVar22 & 0xff000000000000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar21;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar22 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar22 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          pbVar15[(ulong)bVar32 + 2] = 0;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          *pbVar30 = bVar16 | bVar9;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar33 = (uVar6 & 0xff0000) == 0;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          pbVar30[(ulong)bVar33 + 1] = bVar20;
          pbVar30[(ulong)bVar33 + 2] = 0;
          bVar32 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar33 + 2;
          if (bVar32) {
            lVar23 = (ulong)bVar33 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar18 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar16;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar18;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar20;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar16;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar18;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x22];
  if (block[0x22] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar21 = (byte)(uVar31 >> 0x28);
        bVar26 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar26;
          pbVar15[2] = bVar21;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar26;
          pbVar15[uVar22 + 2] = 0;
          uVar22 = ~uVar31;
          bVar32 = (uVar22 & 0xff000000000000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar21;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar22 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar22 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          pbVar15[(ulong)bVar32 + 2] = 0;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          *pbVar30 = bVar16 | bVar9;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar33 = (uVar6 & 0xff0000) == 0;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          pbVar30[(ulong)bVar33 + 1] = bVar20;
          pbVar30[(ulong)bVar33 + 2] = 0;
          bVar32 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar33 + 2;
          if (bVar32) {
            lVar23 = (ulong)bVar33 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar9 = (byte)(uVar31 >> 0x18);
      bVar18 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar16;
        pbVar15[3] = bVar18;
        pbVar15[4] = bVar9;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar20;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar16;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar18;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar9;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x1b];
  if (block[0x1b] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar21 = (byte)(uVar31 >> 0x28);
        bVar26 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar26;
          pbVar15[2] = bVar21;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar26;
          pbVar15[uVar22 + 2] = 0;
          uVar22 = ~uVar31;
          bVar32 = (uVar22 & 0xff000000000000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar21;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar22 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar22 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          pbVar15[(ulong)bVar32 + 2] = 0;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          *pbVar30 = bVar16 | bVar9;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar33 = (uVar6 & 0xff0000) == 0;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          pbVar30[(ulong)bVar33 + 1] = bVar20;
          pbVar30[(ulong)bVar33 + 2] = 0;
          bVar32 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar33 + 2;
          if (bVar32) {
            lVar23 = (ulong)bVar33 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar9 = (byte)(uVar31 >> 0x18);
      bVar16 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar16;
        pbVar15[4] = bVar9;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar20;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar16;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar9;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x14];
  if (block[0x14] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar21 = (byte)(uVar31 >> 0x28);
        bVar26 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar26;
          pbVar15[2] = bVar21;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar26;
          pbVar15[uVar22 + 2] = 0;
          uVar22 = ~uVar31;
          bVar32 = (uVar22 & 0xff000000000000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar21;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar22 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar22 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          pbVar15[(ulong)bVar32 + 2] = 0;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          *pbVar30 = bVar16 | bVar9;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar33 = (uVar6 & 0xff0000) == 0;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          pbVar30[(ulong)bVar33 + 1] = bVar20;
          pbVar30[(ulong)bVar33 + 2] = 0;
          bVar32 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar33 + 2;
          if (bVar32) {
            lVar23 = (ulong)bVar33 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar20;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0xd];
  if (block[0xd] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar26 = (byte)(uVar31 >> 0x28);
        bVar21 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar21;
          pbVar15[2] = bVar26;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar21;
          pbVar15[uVar22 + 2] = 0;
          uVar22 = ~uVar31;
          bVar32 = (uVar22 & 0xff000000000000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar26;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar22 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar22 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          pbVar15[(ulong)bVar32 + 2] = 0;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          *pbVar30 = bVar16 | bVar9;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar33 = (uVar6 & 0xff0000) == 0;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          pbVar30[(ulong)bVar33 + 1] = bVar20;
          pbVar30[(ulong)bVar33 + 2] = 0;
          bVar32 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar33 + 2;
          if (bVar32) {
            lVar23 = (ulong)bVar33 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar20;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[6];
  if (block[6] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar26 = (byte)(uVar31 >> 0x28);
        bVar21 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar21;
          pbVar15[2] = bVar26;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar21;
          pbVar15[uVar22 + 2] = 0;
          uVar22 = ~uVar31;
          bVar32 = (uVar22 & 0xff000000000000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar26;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar22 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar22 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          pbVar15[(ulong)bVar32 + 2] = 0;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          *pbVar30 = bVar16 | bVar9;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar33 = (uVar6 & 0xff0000) == 0;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          pbVar30[(ulong)bVar33 + 1] = bVar20;
          pbVar30[(ulong)bVar33 + 2] = 0;
          bVar32 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar33 + 2;
          if (bVar32) {
            lVar23 = (ulong)bVar33 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar18 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar16;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar18;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar20;
        uVar19 = ~uVar31;
        bVar32 = (uVar19 & 0xff000000000000) == 0;
        pbVar15[uVar29 + 2] = 0;
        pbVar30[(ulong)bVar32 + 1] = bVar16;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar19 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar19 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar18;
        pbVar15[(ulong)bVar32 + 2] = 0;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        *pbVar30 = bVar11;
        uVar14 = ~(uint)uVar31;
        bVar33 = (uVar14 & 0xff0000) == 0;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        pbVar30[(ulong)bVar33 + 1] = bVar8;
        pbVar30[(ulong)bVar33 + 2] = 0;
        bVar32 = (uVar14 & 0xff00) == 0;
        lVar23 = (ulong)bVar33 + 2;
        if (bVar32) {
          lVar23 = (ulong)bVar33 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[7];
  if (block[7] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar21 = (byte)(uVar31 >> 0x28);
        bVar26 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar26;
          pbVar15[2] = bVar21;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar26;
          uVar29 = ~uVar31;
          bVar32 = (uVar29 & 0xff000000000000) == 0;
          pbVar15[uVar22 + 2] = 0;
          pbVar30[(ulong)bVar32 + 1] = bVar21;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar29 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar29 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          pbVar15[(ulong)bVar32 + 2] = 0;
          *pbVar30 = bVar16 | bVar9;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar32 = (uVar6 & 0xff0000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar20;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar29 + 1] = bVar20;
        pbVar15[uVar29 + 2] = 0;
        uVar29 = ~uVar31;
        bVar32 = (uVar29 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar29 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0xe];
  if (block[0xe] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < (int)uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar21 = (byte)(uVar31 >> 0x28);
        bVar26 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar26;
          pbVar15[2] = bVar21;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar26;
          uVar29 = ~uVar31;
          bVar32 = (uVar29 & 0xff000000000000) == 0;
          pbVar15[uVar22 + 2] = 0;
          pbVar30[(ulong)bVar32 + 1] = bVar21;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar29 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar29 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          pbVar15[(ulong)bVar32 + 2] = 0;
          *pbVar30 = bVar16 | bVar9;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar32 = (uVar6 & 0xff0000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar20;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar20 = (byte)(uVar31 >> 0x28);
      bVar18 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar29 + 1] = bVar18;
        pbVar15[uVar29 + 2] = 0;
        uVar29 = ~uVar31;
        bVar32 = (uVar29 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar20;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar29 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x15];
  if (block[0x15] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < (int)uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar21 = (byte)(uVar31 >> 0x28);
        bVar26 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar26;
          pbVar15[2] = bVar21;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar26;
          uVar29 = ~uVar31;
          bVar32 = (uVar29 & 0xff000000000000) == 0;
          pbVar15[uVar22 + 2] = 0;
          pbVar30[(ulong)bVar32 + 1] = bVar21;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar29 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar29 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          pbVar15[(ulong)bVar32 + 2] = 0;
          *pbVar30 = bVar16 | bVar9;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar32 = (uVar6 & 0xff0000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar20;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar9 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar9;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar29 + 1] = bVar9;
        pbVar15[uVar29 + 2] = 0;
        uVar29 = ~uVar31;
        bVar32 = (uVar29 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar29 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x1c];
  if (block[0x1c] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < (int)uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar21 = (byte)(uVar31 >> 0x28);
        bVar26 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar26;
          pbVar15[2] = bVar21;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[uVar22 + 1] = bVar26;
          uVar29 = ~uVar31;
          bVar32 = (uVar29 & 0xff000000000000) == 0;
          pbVar15[uVar22 + 2] = 0;
          pbVar30[(ulong)bVar32 + 1] = bVar21;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar29 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar29 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          pbVar15[(ulong)bVar32 + 2] = 0;
          *pbVar30 = bVar16 | bVar9;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar32 = (uVar6 & 0xff0000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar20;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar9 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar9;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar29 + 1] = bVar9;
        pbVar15[uVar29 + 2] = 0;
        uVar29 = ~uVar31;
        bVar32 = (uVar29 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar29 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x23];
  if (block[0x23] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    if (0xff < (int)uVar25) {
      iVar13 = iVar5 - actbl->ehufsi[0xf0];
      if (iVar13 < 0) {
        uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
        uVar6 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
        uVar22 = uVar6 | uVar31;
        bVar24 = (byte)(uVar31 >> 0x38);
        *pbVar15 = bVar24;
        bVar18 = (byte)uVar22;
        bVar20 = (byte)(uVar22 >> 8);
        bVar27 = (byte)(uVar31 >> 0x20);
        bVar26 = (byte)(uVar31 >> 0x28);
        bVar21 = (byte)(uVar31 >> 0x30);
        bVar9 = (byte)(uVar31 >> 0x10);
        bVar8 = (byte)(uVar31 >> 0x18);
        bVar16 = (byte)(uVar6 >> 0x10);
        bVar10 = (byte)(uVar6 >> 0x18);
        if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
          pbVar15[1] = bVar21;
          pbVar15[2] = bVar26;
          pbVar15[3] = bVar27;
          pbVar15[4] = bVar10 | bVar8;
          pbVar15[5] = bVar16 | bVar9;
          pbVar15[6] = bVar20;
          pbVar15[7] = bVar18;
          pbVar15 = pbVar15 + 8;
        }
        else {
          uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
          pbVar30 = pbVar15 + 1;
          if (bVar24 == 0xff) {
            pbVar30 = pbVar15 + 2;
          }
          pbVar15[1] = 0;
          pbVar15[uVar22 + 1] = bVar21;
          pbVar15[uVar22 + 2] = 0;
          uVar22 = ~uVar31;
          bVar32 = (uVar22 & 0xff000000000000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar26;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar22 & 0xff0000000000) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar15 = pbVar30 + lVar23;
          *pbVar15 = bVar27;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          bVar32 = (uVar22 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar32 + 1] = bVar10 | bVar8;
          uVar28 = (uVar6 | (uint)uVar31) & 0xff000000;
          lVar23 = (ulong)bVar32 + 3;
          if (uVar28 != 0xff000000) {
            lVar23 = (ulong)bVar32 + 2;
          }
          pbVar30 = pbVar15 + lVar23;
          pbVar15[(ulong)bVar32 + 2] = 0;
          *pbVar30 = bVar16 | bVar9;
          pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
          uVar6 = ~(uVar6 | (uint)uVar31);
          bVar32 = (uVar6 & 0xff0000) == 0;
          pbVar30[(ulong)bVar32 + 1] = bVar20;
          pbVar30[(ulong)bVar32 + 2] = 0;
          bVar33 = (uVar6 & 0xff00) == 0;
          lVar23 = (ulong)bVar32 + 2;
          if (bVar33) {
            lVar23 = (ulong)bVar32 + 3;
          }
          pbVar30[lVar23] = bVar18;
          pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
          pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
        }
        iVar5 = iVar13 + 0x40;
        uVar31 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar31 = (ulong)actbl->ehufco[0xf0] | uVar31 << (actbl->ehufsi[0xf0] & 0x3fU);
        iVar5 = iVar13;
      }
      uVar25 = uVar25 - 0x100;
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar13 = iVar5 - iVar12;
    uVar22 = (ulong)(int)uVar14;
    if (iVar13 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar13 & 0x1fU)) | uVar31 << ((byte)iVar5 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar29 + 1] = bVar20;
        pbVar15[uVar29 + 2] = 0;
        uVar29 = ~uVar31;
        bVar32 = (uVar29 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar29 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
    }
    else {
      uVar22 = uVar22 | uVar31 << ((byte)iVar12 & 0x3f);
      iVar5 = iVar13;
    }
    uVar25 = 0;
    uVar31 = uVar22;
  }
  uVar14 = (uint)block[0x2a];
  if (block[0x2a] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar9 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar9;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar9;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x31];
  if (block[0x31] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x38];
  if (block[0x38] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar18 = (byte)(uVar31 >> 0x20);
      bVar9 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar9;
        pbVar15[3] = bVar18;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar9;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar18;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x39];
  if (block[0x39] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x32];
  if (block[0x32] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar9 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar9;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar9;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x2b];
  if (block[0x2b] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x24];
  if (block[0x24] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar18 = (byte)(uVar31 >> 0x20);
      bVar9 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar9;
        pbVar15[3] = bVar18;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar9;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar18;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x1d];
  if (block[0x1d] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar9 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar9;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar9;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x16];
  if (block[0x16] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0xf];
  if (block[0xf] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar20 = (byte)(uVar31 >> 0x28);
      bVar18 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar18;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar20;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x17];
  if (block[0x17] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x1e];
  if (block[0x1e] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar18 = (byte)(uVar31 >> 0x20);
      bVar9 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar9;
        pbVar15[3] = bVar18;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar9;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar18;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x25];
  if (block[0x25] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar9 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar9;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar9;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x2c];
  if (block[0x2c] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar9 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar9;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar9;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x33];
  if (block[0x33] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar20 = (byte)(uVar31 >> 0x28);
      bVar18 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar18;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar20;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x3a];
  if (block[0x3a] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x3b];
  if (block[0x3b] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar18 = (byte)(uVar31 >> 0x20);
      bVar9 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar9;
        pbVar15[3] = bVar18;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar9;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar18;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x34];
  if (block[0x34] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar20 = (byte)(uVar31 >> 0x28);
      bVar18 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar18;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar20;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x2d];
  if (block[0x2d] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x26];
  if (block[0x26] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar20 = (byte)(uVar31 >> 0x28);
      bVar18 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar18;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar20;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x1f];
  if (block[0x1f] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar20 = (byte)(uVar31 >> 0x28);
      bVar18 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar18;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar20;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x27];
  if (block[0x27] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x2e];
  if (block[0x2e] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar9 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar9;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar9;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x35];
  if (block[0x35] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar9 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar9;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar9;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x3c];
  if (block[0x3c] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x3d];
  if (block[0x3d] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x36];
  if (block[0x36] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar9 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar9;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar9;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x2f];
  if (block[0x2f] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar20 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar20;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x37];
  if (block[0x37] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar8 = (byte)(uVar31 >> 0x28);
          bVar16 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar16;
            pbVar15[2] = bVar8;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar16;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar8;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar9 = (byte)(uVar31 >> 0x28);
      bVar18 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar9;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar18;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar9;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  uVar14 = (uint)block[0x3e];
  if (block[0x3e] == 0) {
    uVar25 = uVar25 + 0x10;
  }
  else {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar9 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar18 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar18;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar9;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar18;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar9;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar9 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar21 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar21;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar18 = (byte)(uVar31 >> 0x28);
      bVar9 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar9;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar21 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar9;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar18;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar25 = 0;
      uVar31 = (long)(int)uVar14;
    }
    else {
      uVar25 = 0;
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  sVar2 = block[0x3f];
  uVar14 = (uint)sVar2;
  if (sVar2 != 0) {
    uVar6 = -uVar14;
    if (0 < (int)uVar14) {
      uVar6 = uVar14;
    }
    bVar11 = ""[uVar6];
    uVar6 = uVar25;
    iVar13 = iVar5;
    if (0xff < (int)uVar25) {
      do {
        iVar13 = iVar5 - actbl->ehufsi[0xf0];
        if (iVar13 < 0) {
          uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
          uVar25 = actbl->ehufco[0xf0] >> (-(char)iVar13 & 0x1fU);
          uVar22 = uVar25 | uVar31;
          bVar10 = (byte)(uVar31 >> 0x38);
          *pbVar15 = bVar10;
          bVar21 = (byte)(uVar31 >> 0x20);
          bVar18 = (byte)uVar22;
          bVar20 = (byte)(uVar22 >> 8);
          bVar9 = (byte)(uVar22 >> 0x18);
          bVar16 = (byte)(uVar31 >> 0x28);
          bVar8 = (byte)(uVar31 >> 0x30);
          if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
            pbVar15[1] = bVar8;
            pbVar15[2] = bVar16;
            pbVar15[3] = bVar21;
            pbVar15[4] = bVar9;
            pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
            pbVar15[6] = bVar20;
            pbVar15[7] = bVar18;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
            pbVar30 = pbVar15 + 1;
            if (bVar10 == 0xff) {
              pbVar30 = pbVar15 + 2;
            }
            pbVar15[uVar29 + 1] = bVar8;
            pbVar15[uVar29 + 2] = 0;
            uVar29 = ~uVar31;
            bVar32 = (uVar29 & 0xff000000000000) == 0;
            pbVar30[(ulong)bVar32 + 1] = bVar16;
            pbVar30[(ulong)bVar32 + 2] = 0;
            bVar33 = (uVar29 & 0xff0000000000) == 0;
            lVar23 = (ulong)bVar32 + 2;
            if (bVar33) {
              lVar23 = (ulong)bVar32 + 3;
            }
            pbVar15 = pbVar30 + lVar23;
            *pbVar15 = bVar21;
            pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
            bVar32 = (uVar29 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar32 + 1] = bVar9;
            pbVar15[(ulong)bVar32 + 2] = 0;
            uVar28 = (uVar25 | (uint)uVar31) & 0xff000000;
            lVar23 = (ulong)bVar32 + 3;
            if (uVar28 != 0xff000000) {
              lVar23 = (ulong)bVar32 + 2;
            }
            pbVar30 = pbVar15 + lVar23;
            *pbVar30 = (byte)(uVar22 >> 0x10);
            uVar25 = ~(uVar25 | (uint)uVar31);
            bVar33 = (uVar25 & 0xff0000) == 0;
            pbVar15[(ulong)(uVar28 == 0xff000000) + (ulong)bVar32 + 3] = 0;
            pbVar30[(ulong)bVar33 + 1] = bVar20;
            pbVar30[(ulong)bVar33 + 2] = 0;
            bVar32 = (uVar25 & 0xff00) == 0;
            lVar23 = (ulong)bVar33 + 2;
            if (bVar32) {
              lVar23 = (ulong)bVar33 + 3;
            }
            pbVar30[lVar23] = bVar18;
            pbVar30[(ulong)bVar32 + (ulong)bVar33 + 3] = 0;
            pbVar15 = pbVar30 + lVar23 + (ulong)(bVar18 == 0xff) + 1;
          }
          iVar5 = iVar13 + 0x40;
          uVar31 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar31 = uVar31 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar5 = iVar13;
        }
        uVar25 = uVar6 - 0x100;
        bVar32 = 0x1ff < (int)uVar6;
        uVar6 = uVar25;
        iVar13 = iVar5;
      } while (bVar32);
    }
    uVar14 = actbl->ehufco[(ulong)uVar25 + (ulong)bVar11] << (bVar11 & 0x1f) |
             ((int)uVar14 >> 0x1f) + uVar14 & ~(uint)(-1L << (bVar11 & 0x3f));
    iVar12 = (int)actbl->ehufsi[(ulong)uVar25 + (ulong)bVar11] + (uint)bVar11;
    iVar5 = iVar13 - iVar12;
    if (iVar5 < 0) {
      uVar31 = (long)((int)uVar14 >> (-(char)iVar5 & 0x1fU)) | uVar31 << ((byte)iVar13 & 0x3f);
      bVar18 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar18;
      bVar10 = (byte)uVar31;
      bVar8 = (byte)(uVar31 >> 8);
      bVar16 = (byte)(uVar31 >> 0x18);
      bVar9 = (byte)(uVar31 >> 0x20);
      bVar20 = (byte)(uVar31 >> 0x28);
      bVar21 = (byte)(uVar31 >> 0x30);
      bVar11 = (byte)(uVar31 >> 0x10);
      if ((uVar31 & 0x8080808080808080 & 0xfefefefefefefefe - uVar31) == 0) {
        pbVar15[1] = bVar21;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar9;
        pbVar15[4] = bVar16;
        pbVar15[5] = bVar11;
        pbVar15[6] = bVar8;
        pbVar15[7] = bVar10;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar22 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar22 + 1] = bVar21;
        pbVar15[uVar22 + 2] = 0;
        uVar22 = ~uVar31;
        bVar32 = (uVar22 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar20;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar22 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar9;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar22 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar16;
        uVar25 = (uint)uVar31 & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar25 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = bVar11;
        pbVar15[(ulong)(uVar25 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uint)uVar31;
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar10;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar10 == 0xff) + 1;
      }
      iVar5 = iVar5 + 0x40;
      uVar31 = (ulong)(int)uVar14;
    }
    else {
      uVar31 = (long)(int)uVar14 | uVar31 << ((byte)iVar12 & 0x3f);
    }
  }
  if (sVar2 == 0) {
    iVar13 = iVar5 - actbl->ehufsi[0];
    if (iVar13 < 0) {
      uVar31 = uVar31 << ((byte)iVar5 & 0x3f);
      uVar25 = actbl->ehufco[0] >> (-(char)iVar13 & 0x1fU);
      uVar22 = uVar25 | uVar31;
      bVar11 = (byte)(uVar31 >> 0x38);
      *pbVar15 = bVar11;
      bVar20 = (byte)(uVar31 >> 0x20);
      bVar16 = (byte)uVar22;
      bVar9 = (byte)(uVar22 >> 8);
      bVar18 = (byte)(uVar22 >> 0x18);
      bVar8 = (byte)(uVar31 >> 0x28);
      bVar10 = (byte)(uVar31 >> 0x30);
      if ((uVar22 & 0x8080808080808080 & 0xfefefefefefefefe - uVar22) == 0) {
        pbVar15[1] = bVar10;
        pbVar15[2] = bVar8;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar18;
        pbVar15[5] = (byte)(uVar25 >> 0x10) | (byte)(uVar31 >> 0x10);
        pbVar15[6] = bVar9;
        pbVar15[7] = bVar16;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar29 = (ulong)(uVar31 >> 0x38 == 0xff);
        pbVar30 = pbVar15 + 1;
        if (bVar11 == 0xff) {
          pbVar30 = pbVar15 + 2;
        }
        pbVar15[uVar29 + 1] = bVar10;
        pbVar15[uVar29 + 2] = 0;
        uVar29 = ~uVar31;
        bVar32 = (uVar29 & 0xff000000000000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar8;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar29 & 0xff0000000000) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar15 = pbVar30 + lVar23;
        *pbVar15 = bVar20;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        bVar32 = (uVar29 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar32 + 1] = bVar18;
        uVar14 = (uVar25 | (uint)uVar31) & 0xff000000;
        lVar23 = (ulong)bVar32 + 3;
        if (uVar14 != 0xff000000) {
          lVar23 = (ulong)bVar32 + 2;
        }
        pbVar30 = pbVar15 + lVar23;
        pbVar15[(ulong)bVar32 + 2] = 0;
        *pbVar30 = (byte)(uVar22 >> 0x10);
        pbVar15[(ulong)(uVar14 == 0xff000000) + (ulong)bVar32 + 3] = 0;
        uVar25 = ~(uVar25 | (uint)uVar31);
        bVar32 = (uVar25 & 0xff0000) == 0;
        pbVar30[(ulong)bVar32 + 1] = bVar9;
        pbVar30[(ulong)bVar32 + 2] = 0;
        bVar33 = (uVar25 & 0xff00) == 0;
        lVar23 = (ulong)bVar32 + 2;
        if (bVar33) {
          lVar23 = (ulong)bVar32 + 3;
        }
        pbVar30[lVar23] = bVar16;
        pbVar30[(ulong)bVar33 + (ulong)bVar32 + 3] = 0;
        pbVar15 = pbVar30 + lVar23 + (ulong)(bVar16 == 0xff) + 1;
      }
      iVar5 = iVar13 + 0x40;
      uVar31 = (ulong)actbl->ehufco[0];
    }
    else {
      uVar31 = uVar31 << (actbl->ehufsi[0] & 0x3fU) | (ulong)actbl->ehufco[0];
      iVar5 = iVar13;
    }
  }
  (state->cur).put_buffer.c = uVar31;
  (state->cur).free_bits = iVar5;
  if (uVar17 < 0x200) {
    pbVar30 = local_238;
    for (uVar17 = (long)pbVar15 - (long)pbVar30; uVar17 != 0; uVar17 = uVar17 - uVar31) {
      uVar31 = state->free_in_buffer;
      if (uVar17 < state->free_in_buffer) {
        uVar31 = uVar17;
      }
      memcpy(state->next_output_byte,pbVar30,uVar31);
      state->next_output_byte = state->next_output_byte + uVar31;
      psVar1 = &state->free_in_buffer;
      *psVar1 = *psVar1 - uVar31;
      if (*psVar1 == 0) {
        pjVar4 = state->cinfo->dest;
        bVar7 = (*pjVar4->empty_output_buffer)(state->cinfo);
        if (bVar7 == 0) {
          return 0;
        }
        state->next_output_byte = pjVar4->next_output_byte;
        state->free_in_buffer = pjVar4->free_in_buffer;
      }
      pbVar30 = pbVar30 + uVar31;
    }
  }
  else {
    state->free_in_buffer =
         (size_t)(state->next_output_byte + (state->free_in_buffer - (long)pbVar15));
    state->next_output_byte = pbVar15;
  }
  return 1;
}

Assistant:

LOCAL(boolean)
encode_one_block(working_state *state, JCOEFPTR block, int last_dc_val,
                 c_derived_tbl *dctbl, c_derived_tbl *actbl)
{
  int temp, nbits, free_bits;
  bit_buf_type put_buffer;
  JOCTET _buffer[BUFSIZE], *buffer;
  int localbuf = 0;

  free_bits = state->cur.free_bits;
  put_buffer = state->cur.put_buffer.c;
  LOAD_BUFFER()

  /* Encode the DC coefficient difference per section F.1.2.1 */

  temp = block[0] - last_dc_val;

  /* This is a well-known technique for obtaining the absolute value without a
   * branch.  It is derived from an assembly language technique presented in
   * "How to Optimize for the Pentium Processors", Copyright (c) 1996, 1997 by
   * Agner Fog.  This code assumes we are on a two's complement machine.
   */
  nbits = temp >> (CHAR_BIT * sizeof(int) - 1);
  temp += nbits;
  nbits ^= temp;

  /* Find the number of bits needed for the magnitude of the coefficient */
  nbits = JPEG_NBITS(nbits);

  /* Emit the Huffman-coded symbol for the number of bits.
   * Emit that number of bits of the value, if positive,
   * or the complement of its magnitude, if negative.
   */
  PUT_CODE(dctbl->ehufco[nbits], dctbl->ehufsi[nbits])

  /* Encode the AC coefficients per section F.1.2.2 */

  {
    int r = 0;                  /* r = run length of zeros */

/* Manually unroll the k loop to eliminate the counter variable.  This
 * improves performance greatly on systems with a limited number of
 * registers (such as x86.)
 */
#define kloop(jpeg_natural_order_of_k) { \
  if ((temp = block[jpeg_natural_order_of_k]) == 0) { \
    r += 16; \
  } else { \
    /* Branch-less absolute value, bitwise complement, etc., same as above */ \
    nbits = temp >> (CHAR_BIT * sizeof(int) - 1); \
    temp += nbits; \
    nbits ^= temp; \
    nbits = JPEG_NBITS_NONZERO(nbits); \
    /* if run length > 15, must emit special run-length-16 codes (0xF0) */ \
    while (r >= 16 * 16) { \
      r -= 16 * 16; \
      PUT_BITS(actbl->ehufco[0xf0], actbl->ehufsi[0xf0]) \
    } \
    /* Emit Huffman symbol for run length / number of bits */ \
    r += nbits; \
    PUT_CODE(actbl->ehufco[r], actbl->ehufsi[r]) \
    r = 0; \
  } \
}